

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
TransformPromiseNode<kj::AuthenticatedStream,_kj::_::IdentityFunc<kj::Promise<kj::AuthenticatedStream>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:971:13)>
::getImpl(TransformPromiseNode<kj::AuthenticatedStream,_kj::_::IdentityFunc<kj::Promise<kj::AuthenticatedStream>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:971:13)>
          *this,ExceptionOrValue *output)

{
  Exception *in;
  ExceptionOr<kj::Promise<kj::AuthenticatedStream>_> *pEVar1;
  AuthenticatedStream *in_00;
  Promise<kj::AuthenticatedStream> local_568;
  ExceptionOr<kj::Promise<kj::AuthenticatedStream>_> local_560;
  AuthenticatedStream *local_3b8;
  AuthenticatedStream *depValue;
  AuthenticatedStream *_depValue742;
  ExceptionOr<kj::Promise<kj::AuthenticatedStream>_> local_3a0;
  Exception *local_1f8;
  Exception *depException;
  Exception *_depException738;
  undefined1 local_1d8 [8];
  ExceptionOr<kj::AuthenticatedStream> depResult;
  ExceptionOrValue *output_local;
  TransformPromiseNode<kj::AuthenticatedStream,_kj::_::IdentityFunc<kj::Promise<kj::AuthenticatedStream>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:971:13)>
  *this_local;
  
  depResult.value.ptr.field_1.value.peerIdentity.ptr = (PeerIdentity *)output;
  ExceptionOr<kj::AuthenticatedStream>::ExceptionOr
            ((ExceptionOr<kj::AuthenticatedStream> *)local_1d8);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1d8);
  depException = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1d8);
  if (depException == (Exception *)0x0) {
    depValue = readMaybe<kj::AuthenticatedStream>
                         ((Maybe<kj::AuthenticatedStream> *)
                          ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1.value.
                                  details.builder + 0x18));
    if (depValue != (AuthenticatedStream *)0x0) {
      local_3b8 = depValue;
      in_00 = mv<kj::AuthenticatedStream>(depValue);
      MaybeVoidCaller<kj::AuthenticatedStream,kj::Promise<kj::AuthenticatedStream>>::
      apply<kj::_::IdentityFunc<kj::Promise<kj::AuthenticatedStream>>>
                ((MaybeVoidCaller<kj::AuthenticatedStream,kj::Promise<kj::AuthenticatedStream>> *)
                 &local_568,(IdentityFunc<kj::Promise<kj::AuthenticatedStream>_> *)&this->field_0x20
                 ,in_00);
      TransformPromiseNodeBase::handle<kj::Promise<kj::AuthenticatedStream>>
                (&local_560,&this->super_TransformPromiseNodeBase,&local_568);
      pEVar1 = ExceptionOrValue::as<kj::Promise<kj::AuthenticatedStream>>
                         ((ExceptionOrValue *)depResult.value.ptr.field_1.value.peerIdentity.ptr);
      ExceptionOr<kj::Promise<kj::AuthenticatedStream>_>::operator=(pEVar1,&local_560);
      ExceptionOr<kj::Promise<kj::AuthenticatedStream>_>::~ExceptionOr(&local_560);
      Promise<kj::AuthenticatedStream>::~Promise(&local_568);
    }
  }
  else {
    local_1f8 = depException;
    in = mv<kj::Exception>(depException);
    MaybeVoidCaller<kj::Exception,kj::Promise<kj::AuthenticatedStream>>::
    apply<kj::TlsContext::wrapServer(kj::AuthenticatedStream)::__2>
              ((MaybeVoidCaller<kj::Exception,kj::Promise<kj::AuthenticatedStream>> *)&_depValue742,
               &this->errorHandler,in);
    TransformPromiseNodeBase::handle<kj::Promise<kj::AuthenticatedStream>>
              (&local_3a0,&this->super_TransformPromiseNodeBase,
               (Promise<kj::AuthenticatedStream> *)&_depValue742);
    pEVar1 = ExceptionOrValue::as<kj::Promise<kj::AuthenticatedStream>>
                       ((ExceptionOrValue *)depResult.value.ptr.field_1.value.peerIdentity.ptr);
    ExceptionOr<kj::Promise<kj::AuthenticatedStream>_>::operator=(pEVar1,&local_3a0);
    ExceptionOr<kj::Promise<kj::AuthenticatedStream>_>::~ExceptionOr(&local_3a0);
    Promise<kj::AuthenticatedStream>::~Promise((Promise<kj::AuthenticatedStream> *)&_depValue742);
  }
  ExceptionOr<kj::AuthenticatedStream>::~ExceptionOr
            ((ExceptionOr<kj::AuthenticatedStream> *)local_1d8);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    // Derive return type from DepT to reduce templating.
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = handle<T>(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(depException)));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }